

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction_base.cpp
# Opt level: O0

vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *
cfd::api::TransactionApiBase::CreateMultisigSignatureData
          (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_list,
          Script *redeem_script)

{
  const_iterator __position;
  bool bVar1;
  byte bVar2;
  undefined8 uVar3;
  Script *in_RDX;
  CfdException *in_RDI;
  SignParameter *sign_param_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *__range2_1;
  Pubkey related_pubkey;
  SignParameter sign_param;
  iterator itr;
  string pubkey_hex;
  Pubkey *pubkey;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *__range2;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *signature_data;
  SignParameter *in_stack_fffffffffffffd58;
  SignParameter *in_stack_fffffffffffffd60;
  allocator *paVar4;
  undefined7 in_stack_fffffffffffffd68;
  iterator in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7c;
  byte in_stack_fffffffffffffd7d;
  undefined1 in_stack_fffffffffffffd7e;
  undefined1 in_stack_fffffffffffffd7f;
  CfdException *this;
  value_type local_270;
  undefined6 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdae;
  allocator in_stack_fffffffffffffdaf;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *in_stack_fffffffffffffdb0;
  string local_230;
  Pubkey local_210;
  string local_1f8 [16];
  undefined8 in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  Pubkey local_1c0;
  reference local_1a8;
  SignParameter *local_1a0;
  __normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
  local_198;
  undefined1 *local_190;
  value_type local_188;
  SignParameter *local_168;
  undefined4 local_160;
  byte local_159;
  string local_158;
  Pubkey local_138 [6];
  SignParameter *local_a8;
  __normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
  local_a0;
  string local_98;
  reference local_78;
  __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
  local_70;
  __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
  local_68;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *local_60;
  undefined1 local_55;
  undefined1 local_48 [24];
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_30;
  Script *local_18;
  
  this = in_RDI;
  local_18 = in_RDX;
  core::ScriptUtil::ExtractPubkeysFromMultisigScript(&local_30,in_RDX,(uint32_t *)0x0);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            (in_stack_fffffffffffffdb0,
             (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
             CONCAT17(in_stack_fffffffffffffdaf,
                      CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)));
  local_55 = 0;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this);
  local_60 = &local_30;
  local_68._M_current =
       (Pubkey *)
       std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::begin
                 ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                  in_stack_fffffffffffffd58);
  local_70._M_current =
       (Pubkey *)
       std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::end
                 ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                  in_stack_fffffffffffffd58);
  while (bVar1 = __gnu_cxx::operator!=(&local_68,&local_70), bVar1) {
    local_78 = __gnu_cxx::
               __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
               ::operator*(&local_68);
    core::Pubkey::GetHex_abi_cxx11_(&local_98,local_78);
    local_a0._M_current =
         (SignParameter *)
         std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::begin
                   (in_stack_fffffffffffffd58);
    while( true ) {
      local_a8 = (SignParameter *)
                 std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::end
                           ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                            in_stack_fffffffffffffd58);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                          *)in_stack_fffffffffffffd60,
                         (__normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                          *)in_stack_fffffffffffffd58);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
      ::operator*(&local_a0);
      SignParameter::SignParameter
                ((SignParameter *)in_stack_fffffffffffffe20,
                 (SignParameter *)in_stack_fffffffffffffe18);
      SignParameter::GetRelatedPubkey(in_stack_fffffffffffffd58);
      local_159 = 0;
      in_stack_fffffffffffffd7f = core::Pubkey::IsValid(local_138);
      in_stack_fffffffffffffd7d = true;
      if ((bool)in_stack_fffffffffffffd7f) {
        core::Pubkey::GetHex_abi_cxx11_(&local_158,local_138);
        local_159 = 1;
        in_stack_fffffffffffffd7d = std::operator!=(&local_158,&local_98);
      }
      in_stack_fffffffffffffd7e = in_stack_fffffffffffffd7d;
      if ((local_159 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_158);
      }
      if ((in_stack_fffffffffffffd7d & 1) == 0) {
        __gnu_cxx::
        __normal_iterator<cfd::SignParameter_const*,std::vector<cfd::SignParameter,std::allocator<cfd::SignParameter>>>
        ::__normal_iterator<cfd::SignParameter*>
                  ((__normal_iterator<const_cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                    *)in_stack_fffffffffffffd60,
                   (__normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                    *)in_stack_fffffffffffffd58);
        __position._M_current._4_1_ = in_stack_fffffffffffffd7c;
        __position._M_current._0_4_ = in_stack_fffffffffffffd78;
        __position._M_current._5_1_ = in_stack_fffffffffffffd7d;
        __position._M_current._6_1_ = in_stack_fffffffffffffd7e;
        __position._M_current._7_1_ = in_stack_fffffffffffffd7f;
        in_stack_fffffffffffffd70 =
             std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::erase
                       (in_stack_fffffffffffffd70._M_current,__position);
        local_168 = in_stack_fffffffffffffd70._M_current;
        local_a0._M_current = in_stack_fffffffffffffd70._M_current;
        SignParameter::ConvertToSignature((SignParameter *)in_stack_fffffffffffffe18);
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this,
                   &local_188);
        core::ByteData::~ByteData((ByteData *)0x544a92);
        local_160 = 0;
      }
      else {
        __gnu_cxx::
        __normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
        ::operator++(&local_a0);
        local_160 = 5;
      }
      core::Pubkey::~Pubkey((Pubkey *)0x544aaa);
      SignParameter::~SignParameter(in_stack_fffffffffffffd60);
    }
    std::__cxx11::string::~string((string *)&local_98);
    __gnu_cxx::
    __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
    ::operator++(&local_68);
  }
  local_190 = local_48;
  local_198._M_current =
       (SignParameter *)
       std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::begin
                 (in_stack_fffffffffffffd58);
  local_1a0 = (SignParameter *)
              std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::end
                        ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                         in_stack_fffffffffffffd58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                        *)in_stack_fffffffffffffd60,
                       (__normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                        *)in_stack_fffffffffffffd58);
    if (!bVar1) {
      local_55 = 1;
      local_160 = 1;
      std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
                ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                 in_stack_fffffffffffffd70._M_current);
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                 in_stack_fffffffffffffd70._M_current);
      return (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)in_RDI;
    }
    local_1a8 = __gnu_cxx::
                __normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
                ::operator*(&local_198);
    SignParameter::GetRelatedPubkey(in_stack_fffffffffffffd58);
    bVar2 = core::Pubkey::IsValid(&local_1c0);
    core::Pubkey::~Pubkey((Pubkey *)0x544be0);
    if ((bVar2 & 1) != 0) break;
    SignParameter::ConvertToSignature((SignParameter *)in_stack_fffffffffffffe18);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this,&local_270)
    ;
    core::ByteData::~ByteData((ByteData *)0x544e2f);
    __gnu_cxx::
    __normal_iterator<cfd::SignParameter_*,_std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>_>
    ::operator++(&local_198);
  }
  strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfdapi_transaction_base.cpp"
          ,0x2f);
  SignParameter::GetRelatedPubkey(in_stack_fffffffffffffd58);
  core::Pubkey::GetHex_abi_cxx11_((string *)local_1f8,&local_210);
  core::Script::GetHex_abi_cxx11_(&local_230,local_18);
  core::logger::warn<std::__cxx11::string,std::__cxx11::string_const>
            ((CfdSourceLocation *)in_stack_fffffffffffffd70._M_current,
             (char *)CONCAT17(bVar2,in_stack_fffffffffffffd68),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd58);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string(local_1f8);
  core::Pubkey::~Pubkey((Pubkey *)0x544cac);
  uVar3 = __cxa_allocate_exception(0x30);
  paVar4 = (allocator *)&stack0xfffffffffffffdaf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffdb0,
             "Missing related pubkey in script. Check your signature and pubkey pair.",paVar4);
  core::CfdException::CfdException
            (this,CONCAT13(in_stack_fffffffffffffd7f,
                           CONCAT12(in_stack_fffffffffffffd7e,
                                    CONCAT11(in_stack_fffffffffffffd7d,in_stack_fffffffffffffd7c))),
             (string *)in_stack_fffffffffffffd70._M_current);
  __cxa_throw(uVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

std::vector<ByteData> TransactionApiBase::CreateMultisigSignatureData(
    const std::vector<SignParameter>& sign_list, const Script& redeem_script) {
  std::vector<Pubkey> pubkeys =
      ScriptUtil::ExtractPubkeysFromMultisigScript(redeem_script);
  // get signParams from json request
  std::vector<SignParameter> sign_params = sign_list;

  // set signParam to signature_data (only contains relatedPubkey);
  std::vector<ByteData> signature_data;
  for (const Pubkey& pubkey : pubkeys) {
    std::string pubkey_hex = pubkey.GetHex();
    for (auto itr = sign_params.begin(); itr != sign_params.end();) {
      SignParameter sign_param = *itr;
      Pubkey related_pubkey = sign_param.GetRelatedPubkey();
      if ((!related_pubkey.IsValid()) ||
          (related_pubkey.GetHex() != pubkey_hex)) {
        ++itr;
        continue;
      }

      itr = sign_params.erase(itr);
      signature_data.push_back(sign_param.ConvertToSignature());
    }
  }

  // set the others to signature data
  for (const auto& sign_param : sign_params) {
    // related pubkey not found in script
    if (sign_param.GetRelatedPubkey().IsValid()) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to CreateMultisigSignatureData. Missing related pubkey"
          " in script.: relatedPubkey={}, script={}",
          sign_param.GetRelatedPubkey().GetHex(), redeem_script.GetHex());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Missing related pubkey in script."
          " Check your signature and pubkey pair.");
    }
    signature_data.push_back(sign_param.ConvertToSignature());
  }

  return signature_data;
}